

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_any(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  uint16_t *flags;
  ly_stmt stmt_00;
  uint uVar1;
  lysp_node *plVar2;
  LY_ERR LVar3;
  lysp_node *plVar4;
  lysp_node *plVar5;
  char *pcVar6;
  char *pcVar7;
  uint32_t substmt_index;
  ly_ctx *plVar8;
  lysp_ext_instance **in_R8;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_01;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    plVar4 = (lysp_node *)calloc(1,0x50);
    if (plVar4 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = LY_EMEM;
      ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_any");
    }
    else {
      plVar2 = *siblings;
      if (*siblings != (lysp_node *)0x0) {
        do {
          plVar5 = plVar2;
          plVar2 = plVar5->next;
        } while (plVar2 != (lysp_node *)0x0);
        siblings = &plVar5->next;
      }
      *siblings = plVar4;
      plVar4->nodetype = (ushort)(stmt->kw == LY_STMT_ANYDATA) << 6 | 0x20;
      plVar4->parent = parent;
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert(plVar8,stmt->arg,0,&plVar4->name);
      if ((LVar3 == LY_SUCCESS) &&
         (stmt_01 = stmt->child, LVar3 = LY_SUCCESS, stmt_01 != (lysp_stmt *)0x0)) {
        exts = &plVar4->exts;
        flags = &plVar4->flags;
        do {
          stmt_00 = stmt_01->kw;
          if ((int)stmt_00 < 0x180000) {
            if ((int)stmt_00 < 0xf0000) {
              if (stmt_00 != LY_STMT_CONFIG) {
                substmt_index = (int)plVar4 + 0x20;
                if (stmt_00 != LY_STMT_DESCRIPTION) {
LAB_00168440:
                  if (ctx == (lysp_ctx *)0x0) {
                    plVar8 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar8 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar6 = lyplg_ext_stmt2str(stmt_00);
                  uVar1._0_2_ = plVar4->nodetype;
                  uVar1._2_2_ = plVar4->flags;
                  pcVar7 = lyplg_ext_stmt2str((uint)((~uVar1 & 0x60) != 0) * 0x20 + LY_STMT_ANYDATA)
                  ;
                  ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                          "Invalid keyword \"%s\" as a child of \"%s\".",pcVar6,pcVar7);
                  return LY_EVALID;
                }
                goto LAB_001683d9;
              }
              LVar3 = lysp_stmt_config(ctx,stmt_01,flags,exts);
            }
            else if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
              in_R8 = exts;
              LVar3 = lysp_stmt_ext(ctx,stmt_01,stmt->kw,0,exts);
            }
            else {
              if (stmt_00 != LY_STMT_IF_FEATURE) goto LAB_00168440;
              LVar3 = lysp_stmt_qnames(ctx,stmt_01,&plVar4->iffeatures,(yang_arg)exts,in_R8);
            }
          }
          else if ((int)stmt_00 < 0x270000) {
            if (stmt_00 == LY_STMT_MANDATORY) {
              LVar3 = lysp_stmt_mandatory(ctx,stmt_01,flags,exts);
            }
            else {
              if (stmt_00 != LY_STMT_MUST) goto LAB_00168440;
              LVar3 = lysp_stmt_restrs(ctx,stmt_01,(lysp_restr **)(plVar4 + 1));
            }
          }
          else {
            substmt_index = (int)plVar4 + 0x28;
            if (stmt_00 == LY_STMT_REFERENCE) {
LAB_001683d9:
              in_R8 = exts;
              LVar3 = lysp_stmt_text_field
                                (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
            }
            else if (stmt_00 == LY_STMT_STATUS) {
              LVar3 = lysp_stmt_status(ctx,stmt_01,flags,exts);
            }
            else {
              if (stmt_00 != LY_STMT_WHEN) goto LAB_00168440;
              LVar3 = lysp_stmt_when(ctx,stmt_01,(lysp_when **)&plVar4[1].nodetype);
            }
          }
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          stmt_01 = stmt_01->next;
          LVar3 = LY_SUCCESS;
        } while (stmt_01 != (lysp_stmt *)0x0);
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_any(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent, struct lysp_node **siblings)
{
    struct lysp_node_anydata *any;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new structure and insert into siblings */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, any, next, LY_EMEM);

    any->nodetype = stmt->kw == LY_STMT_ANYDATA ? LYS_ANYDATA : LYS_ANYXML;
    any->parent = parent;

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &any->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &any->flags, &any->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &any->dsc, Y_STR_ARG, &any->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &any->iffeatures, Y_STR_ARG, &any->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(lysp_stmt_mandatory(ctx, child, &any->flags, &any->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &any->musts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &any->ref, Y_STR_ARG, &any->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &any->flags, &any->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &any->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &any->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw),
                    (any->nodetype & LYS_ANYDATA) == LYS_ANYDATA ? lyplg_ext_stmt2str(LY_STMT_ANYDATA) : lyplg_ext_stmt2str(LY_STMT_ANYXML));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}